

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

type __thiscall
chaiscript::Boxed_Number::go<double>(Boxed_Number *this,Opers t_oper,Boxed_Value *t_lhs)

{
  element_type *peVar1;
  bad_any_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Boxed_Value BVar3;
  type tVar4;
  
  if (((t_oper - assign < 7) &&
      (peVar1 = (t_lhs->m_data).
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      , ((peVar1->m_type_info).m_flags & 1) == 0)) && (peVar1->m_return_value == false)) {
    BVar3 = unary_go<double>(this,t_oper,(double *)peVar1->m_data_ptr,t_lhs);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    if ((int)t_oper < 0x1f) {
      this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
      detail::exception::bad_any_cast::bad_any_cast(this_00);
      __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                  detail::exception::bad_any_cast::~bad_any_cast);
    }
    BVar3 = const_unary_go<double>
                      (this,t_oper,
                       (double *)
                       ((t_lhs->m_data).
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->m_const_data_ptr);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  tVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  tVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (type)tVar4.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_lhs) 
          -> typename std::enable_if<std::is_floating_point<LHS>::value, Boxed_Value>::type
      {
        if (t_oper > Operators::non_const_flag && t_oper < Operators::non_const_int_flag && !t_lhs.is_const() && !t_lhs.is_return_value()) {
          return unary_go(t_oper, *static_cast<LHS *>(t_lhs.get_ptr()), t_lhs);
        } else if (t_oper > Operators::const_flag) {
          return const_unary_go(t_oper, *static_cast<const LHS *>(t_lhs.get_const_ptr()));
        } else {
          throw chaiscript::detail::exception::bad_any_cast();
        }
      }